

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

Status __thiscall
wallet::MockableCursor::Next(MockableCursor *this,DataStream *key,DataStream *value)

{
  long lVar1;
  pointer pbVar2;
  Status SVar3;
  pointer pbVar4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar3 = FAIL;
  if (this->m_pass == true) {
    p_Var5 = (this->m_cursor)._M_node;
    if (p_Var5 == (this->m_cursor_end)._M_node) {
      SVar3 = DONE;
    }
    else {
      pbVar4 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish != pbVar4) {
        (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar4;
      }
      key->m_read_pos = 0;
      pbVar2 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish != pbVar2) {
        (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar2;
        pbVar4 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      value->m_read_pos = 0;
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)key,pbVar4,
                 *(undefined8 *)(p_Var5 + 1),p_Var5[1]._M_parent);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)value,
                 (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,p_Var5[1]._M_right,
                 *(undefined8 *)(p_Var5 + 2));
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)(this->m_cursor)._M_node);
      (this->m_cursor)._M_node = p_Var5;
      SVar3 = MORE;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status MockableCursor::Next(DataStream& key, DataStream& value)
{
    if (!m_pass) {
        return Status::FAIL;
    }
    if (m_cursor == m_cursor_end) {
        return Status::DONE;
    }
    key.clear();
    value.clear();
    const auto& [key_data, value_data] = *m_cursor;
    key.write(key_data);
    value.write(value_data);
    m_cursor++;
    return Status::MORE;
}